

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O3

Scope * __thiscall FuncInfo::GetGlobalBlockScope(FuncInfo *this)

{
  Scope *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeFnc *pPVar5;
  
  pPVar5 = this->root;
  if ((pPVar5 == (ParseNodeFnc *)0x0) || ((pPVar5->super_ParseNode).nop != knopProg)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0xb8,"(this->IsGlobalFunction())","this->IsGlobalFunction()");
    if (!bVar3) goto LAB_0089e86d;
    *puVar4 = 0;
    pPVar5 = this->root;
  }
  pSVar1 = pPVar5->pnodeScopes->scope;
  if (((pSVar1 != (Scope *)0x0) && (pSVar1 != this->bodyScope)) &&
     (pSVar1->enclosingScope != this->bodyScope)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0xba,
                       "(scope == nullptr || scope == this->GetBodyScope() || scope->GetEnclosingScope() == this->GetBodyScope())"
                       ,
                       "scope == nullptr || scope == this->GetBodyScope() || scope->GetEnclosingScope() == this->GetBodyScope()"
                      );
    if (!bVar3) {
LAB_0089e86d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return pSVar1;
}

Assistant:

Scope *
FuncInfo::GetGlobalBlockScope() const
{
    Assert(this->IsGlobalFunction());
    Scope * scope = this->root->pnodeScopes->scope;
    Assert(scope == nullptr || scope == this->GetBodyScope() || scope->GetEnclosingScope() == this->GetBodyScope());
    return scope;
}